

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtest.c
# Opt level: O2

void startElementNsDebug(void *ctx,xmlChar *localname,xmlChar *prefix,xmlChar *URI,int nb_namespaces
                        ,xmlChar **namespaces,int nb_attributes,int nb_defaulted,
                        xmlChar **attributes)

{
  long lVar1;
  
  callbacks = callbacks + 1;
  fprintf((FILE *)SAXdebug,"SAX.startElementNs(%s",localname);
  if (prefix == (xmlChar *)0x0) {
    fwrite(", NULL",6,1,(FILE *)SAXdebug);
  }
  else {
    fprintf((FILE *)SAXdebug,", %s",prefix);
  }
  if (URI == (xmlChar *)0x0) {
    fwrite(", NULL",6,1,(FILE *)SAXdebug);
  }
  else {
    fprintf((FILE *)SAXdebug,", \'%s\'",URI);
  }
  fprintf((FILE *)SAXdebug,", %d",(ulong)(uint)nb_namespaces);
  if (namespaces != (xmlChar **)0x0) {
    for (lVar1 = 0; lVar1 < nb_namespaces * 2; lVar1 = lVar1 + 2) {
      fwrite(", xmlns",7,1,(FILE *)SAXdebug);
      if (namespaces[lVar1] != (xmlChar *)0x0) {
        fprintf((FILE *)SAXdebug,":%s");
      }
      fprintf((FILE *)SAXdebug,"=\'%s\'",namespaces[lVar1 + 1]);
    }
  }
  fprintf((FILE *)SAXdebug,", %d, %d",(ulong)(uint)nb_attributes,(ulong)(uint)nb_defaulted);
  if (attributes != (xmlChar **)0x0) {
    for (lVar1 = 0; lVar1 < nb_attributes * 5; lVar1 = lVar1 + 5) {
      if (attributes[lVar1 + 1] == (xmlChar *)0x0) {
        fprintf((FILE *)SAXdebug,", %s=\'",attributes[lVar1]);
      }
      else {
        fprintf((FILE *)SAXdebug,", %s:%s=\'");
      }
      fprintf((FILE *)SAXdebug,"%.4s...\', %d",attributes[lVar1 + 3],
              (ulong)(uint)(*(int *)(attributes + lVar1 + 4) - (int)attributes[lVar1 + 3]));
    }
  }
  fwrite(")\n",2,1,(FILE *)SAXdebug);
  return;
}

Assistant:

static void
startElementNsDebug(void *ctx ATTRIBUTE_UNUSED,
                    const xmlChar *localname,
                    const xmlChar *prefix,
                    const xmlChar *URI,
		    int nb_namespaces,
		    const xmlChar **namespaces,
		    int nb_attributes,
		    int nb_defaulted,
		    const xmlChar **attributes)
{
    int i;

    callbacks++;
    if (quiet)
	return;
    fprintf(SAXdebug, "SAX.startElementNs(%s", (char *) localname);
    if (prefix == NULL)
	fprintf(SAXdebug, ", NULL");
    else
	fprintf(SAXdebug, ", %s", (char *) prefix);
    if (URI == NULL)
	fprintf(SAXdebug, ", NULL");
    else
	fprintf(SAXdebug, ", '%s'", (char *) URI);
    fprintf(SAXdebug, ", %d", nb_namespaces);

    if (namespaces != NULL) {
        for (i = 0;i < nb_namespaces * 2;i++) {
	    fprintf(SAXdebug, ", xmlns");
	    if (namespaces[i] != NULL)
	        fprintf(SAXdebug, ":%s", namespaces[i]);
	    i++;
	    fprintf(SAXdebug, "='%s'", namespaces[i]);
	}
    }
    fprintf(SAXdebug, ", %d, %d", nb_attributes, nb_defaulted);
    if (attributes != NULL) {
        for (i = 0;i < nb_attributes * 5;i += 5) {
	    if (attributes[i + 1] != NULL)
		fprintf(SAXdebug, ", %s:%s='", attributes[i + 1], attributes[i]);
	    else
		fprintf(SAXdebug, ", %s='", attributes[i]);
	    fprintf(SAXdebug, "%.4s...', %d", attributes[i + 3],
		    (int)(attributes[i + 4] - attributes[i + 3]));
	}
    }
    fprintf(SAXdebug, ")\n");
}